

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O3

int derive_mpi(mbedtls_ecp_group *grp,mbedtls_mpi *x,uchar *buf,size_t blen)

{
  int iVar1;
  ulong buflen;
  size_t count;
  
  buflen = grp->nbits + 7 >> 3;
  if (blen <= buflen) {
    buflen = blen;
  }
  iVar1 = mbedtls_mpi_read_binary(x,buf,buflen);
  if (iVar1 == 0) {
    count = buflen * 8 - grp->nbits;
    if ((grp->nbits <= buflen * 8 && count != 0) &&
       (iVar1 = mbedtls_mpi_shift_r(x,count), iVar1 != 0)) {
      return iVar1;
    }
    iVar1 = mbedtls_mpi_cmp_mpi(x,&grp->N);
    if (-1 < iVar1) {
      iVar1 = mbedtls_mpi_sub_mpi(x,x,&grp->N);
      return iVar1;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int derive_mpi( const mbedtls_ecp_group *grp, mbedtls_mpi *x,
                       const unsigned char *buf, size_t blen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n_size = ( grp->nbits + 7 ) / 8;
    size_t use_size = blen > n_size ? n_size : blen;

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( x, buf, use_size ) );
    if( use_size * 8 > grp->nbits )
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( x, use_size * 8 - grp->nbits ) );

    /* While at it, reduce modulo N */
    if( mbedtls_mpi_cmp_mpi( x, &grp->N ) >= 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( x, x, &grp->N ) );

cleanup:
    return( ret );
}